

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

double __thiscall wasm::Literal::floor(Literal *this,double __x)

{
  uintptr_t uVar1;
  double *in_RSI;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  double dVar3;
  
  dVar3 = in_RSI[2];
  if (6 < (ulong)dVar3) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  if (SUB84(dVar3,0) == 5) {
    if (dVar3 != 2.47032822920623e-323) {
      __assert_fail("type == Type::f64",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x131,"double wasm::Literal::getf64() const");
    }
    dVar3 = ::floor(*in_RSI);
    (this->field_0).i64 = (int64_t)dVar3;
    uVar1 = 5;
  }
  else {
    if (SUB84(dVar3,0) != 4) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x407);
    }
    if (dVar3 != 1.97626258336499e-323) {
      __assert_fail("type == Type::f32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x12d,"float wasm::Literal::getf32() const");
    }
    fVar2 = floorf(*(float *)in_RSI);
    dVar3 = (double)CONCAT44(extraout_XMM0_Db,fVar2);
    (this->field_0).i32 = (int32_t)fVar2;
    uVar1 = 4;
  }
  (this->type).id = uVar1;
  return dVar3;
}

Assistant:

Literal Literal::floor() const {
  switch (type.getBasic()) {
    case Type::f32:
      return Literal(std::floor(getf32()));
    case Type::f64:
      return Literal(std::floor(getf64()));
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}